

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PSprite __thiscall DataSourceAmiga::get_map_object_sprite(DataSourceAmiga *this,size_t index)

{
  byte compression;
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  byte bVar8;
  PBuffer *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  byte filling;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *data_00;
  byte bVar9;
  bool bVar10;
  PSprite PVar11;
  PBuffer data;
  undefined1 local_a0 [16];
  PSpriteAmiga pixels;
  PSpriteAmiga mask;
  __shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_50;
  PSpriteAmiga sprite;
  
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,(__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)(index + 0x58));
  get_data_from_catalog((DataSourceAmiga *)&data,index,6,in_RDX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    puVar3 = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read;
    uVar2 = *(ushort *)(puVar3 + 2);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar3 + 4;
    uVar6 = uVar2 << 8 | uVar2 >> 8;
    if ((data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->endianess !=
        EndianessBig) {
      uVar6 = uVar2;
    }
    bVar5 = puVar3[4];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar3 + 5;
    compression = puVar3[5];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar3 + 6;
    bVar1 = puVar3[6];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar3 + 7;
    bVar8 = puVar3[7];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar3 + 8;
    if (compression != 0) {
      if (bVar5 == 0) {
        bVar5 = (byte)(uVar6 / compression);
      }
      iVar7 = 2;
      filling = 0;
      bVar9 = 0;
      while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
        filling = filling >> 1;
        bVar9 = bVar9 >> 1;
        if ((char)bVar8 < '\0') {
          filling = filling | 0x10;
          bVar9 = bVar9 | bVar8 >> 2 & 0x10;
          bVar8 = bVar8 * '\x02';
        }
        bVar8 = bVar8 * '\x02';
      }
      data_00 = &data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_60,data_00);
      decode_mask_sprite((DataSourceAmiga *)&mask,(PBuffer *)data_00,(size_t)&local_60,
                         (ulong)((uint)bVar5 * 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      Buffer::pop_tail((Buffer *)local_a0);
      decode_planned_sprite
                ((DataSourceAmiga *)&pixels,(PBuffer *)(ulong)bVar9,(size_t)local_a0,(ulong)bVar5,
                 compression,filling,(uint8_t *)(ulong)bVar9,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
      std::__shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<DataSourceAmiga::SpriteAmiga,void>
                (local_70,&mask.
                           super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                );
      SpriteAmiga::get_amiga_masked
                ((SpriteAmiga *)&sprite,
                 (PSprite *)
                 pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
      _Var4 = sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).delta_x = 1;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).delta_y = 0;
      iVar7 = 0;
      if (((ulong)in_RDX & 0xfffffffffffffff0) != 0x80) {
        iVar7 = (uint)bVar5 * -4;
      }
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).offset_x = iVar7;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).offset_y = -(uint)bVar1;
      (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
           (_func_int **)
           sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p =
           (pointer)_Var4._M_pi;
      sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sprite.
                  super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pixels.
                  super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_0012d2b5;
    }
  }
  (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source = (_func_int **)0x0;
  (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
LAB_0012d2b5:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar11.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar11.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar11.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceAmiga::get_map_object_sprite(size_t index) {
  PBuffer data = get_data_from_catalog(6, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  data->pop<uint16_t>();  // drop shadow_offset
  uint16_t bitplane_size = data->pop<uint16_t>();
  uint8_t width = data->pop<uint8_t>();
  uint8_t height = data->pop<uint8_t>();
  uint8_t offset_y = data->pop<uint8_t>();
  uint8_t compression = data->pop<uint8_t>();

  if (height == 0) {
    return nullptr;
  }
  if (width == 0) {
    width = bitplane_size / height;
  }

  uint8_t compressed = 0;
  uint8_t filled = 0;
  for (int i = 0 ; i < 2 ; i++) {
    compressed  = compressed >> 1;
    filled = filled >> 1;

    if (compression & 0x80) {
      compressed = compressed | 0x10;
      if (compression & 0x40) {
        filled = filled | 0x10;
      }
      compression = compression << 1;
    }
    compression = compression << 1;
  }

  PSpriteAmiga mask = decode_mask_sprite(data, width * 8, height);
  PSpriteAmiga pixels = decode_planned_sprite(data->pop_tail(), width, height,
                                              compressed, filled, palette);

  PSpriteAmiga sprite = pixels->get_amiga_masked(mask);
  sprite->set_delta(1, 0);
  if ((index >= 128) && (index <= 143)) {
    sprite->set_offset(0, -offset_y);
  } else {
    sprite->set_offset(-width * 4, -offset_y);
  }

  return sprite;
}